

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_recoverable_signature_serialize_compact
              (secp256k1_context *ctx,uchar *output64,int *recid,
              secp256k1_ecdsa_recoverable_signature *sig)

{
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar local_58;
  secp256k1_scalar local_38;
  
  if (output64 == (uchar *)0x0) {
    secp256k1_ecdsa_recoverable_signature_serialize_compact_cold_3();
  }
  else if (sig == (secp256k1_ecdsa_recoverable_signature *)0x0) {
    secp256k1_ecdsa_recoverable_signature_serialize_compact_cold_2();
  }
  else {
    if (recid != (int *)0x0) {
      local_38.d[0] = *(uint64_t *)sig->data;
      local_38.d[1] = *(uint64_t *)(sig->data + 8);
      local_38.d[2] = *(uint64_t *)(sig->data + 0x10);
      local_38.d[3] = *(uint64_t *)(sig->data + 0x18);
      local_58.d[0] = *(uint64_t *)(sig->data + 0x20);
      local_58.d[1] = *(uint64_t *)(sig->data + 0x28);
      local_58.d[2] = *(uint64_t *)(sig->data + 0x30);
      local_58.d[3] = *(uint64_t *)(sig->data + 0x38);
      *recid = (uint)sig->data[0x40];
      secp256k1_scalar_get_b32(output64,&local_38);
      secp256k1_scalar_get_b32(output64 + 0x20,&local_58);
      return 1;
    }
    secp256k1_ecdsa_recoverable_signature_serialize_compact_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_recoverable_signature_serialize_compact(const secp256k1_context* ctx, unsigned char *output64, int *recid, const secp256k1_ecdsa_recoverable_signature* sig) {
    secp256k1_scalar r, s;

    (void)ctx;
    ARG_CHECK(output64 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(recid != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, recid, sig);
    secp256k1_scalar_get_b32(&output64[0], &r);
    secp256k1_scalar_get_b32(&output64[32], &s);
    return 1;
}